

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::Lex::MakeNFA
          (Lex *this,NFA *nfa,String *regExp,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
          *macroNFAs)

{
  bool bVar1;
  RegExprNFAParseElement *pRVar2;
  InputStream local_300;
  pointer local_2f8;
  size_type sStack_2f0;
  undefined8 local_2e8;
  ParseHandler<SGParser::Generator::RegExprNFAParseElement> local_2e0;
  uint local_2d8;
  Lex *local_2d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *local_2c8;
  undefined1 local_2c0 [8];
  ParseMessage msg;
  Parse<SGParser::Generator::RegExprNFAParseElement> parse;
  undefined1 local_e0 [8];
  RegExpTokenizer<SGParser::Generator::RegExprParseToken> tokenizer;
  String local_80;
  String local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *local_40;
  allocator<char> local_32;
  allocator<char> local_31;
  
  if ((this->NFAParseTable).super_ParseTable.Type == None) {
    parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream =
         (_func_int **)&parse;
    parse.pParseTable._0_4_ = 0;
    parse.pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
    parse.Stream.pFirstBlock = (StreamBlock *)0x0;
    parse.Stream.LengthLeft = (size_t)&parse.Stream.ThisPos;
    parse.Stream.ThisPos._0_4_ = 0;
    parse.Stream.RememberLength = 0;
    parse.StackPosition =
         (long)&parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header + 0x18;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parse.Stream.SourceEOFFlag = false;
    parse.Stream._65_7_ = 0;
    parse.Stream.Markers._M_t._M_impl._0_8_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parse.pValidTokenStackPositions = (size_t *)&parse.Token;
    parse.Token.super_TokenCode.Code = 0;
    parse.ReduceLeft = 0;
    parse._188_4_ = 0;
    parse.pStack = (RegExprNFAParseElement *)0x0;
    parse.TopState = 0;
    parse.NextTokenFlag = false;
    parse._165_3_ = 0;
    parse.ErrorStackStr._M_string_length = 0;
    parse.ErrorStackStr.field_2._M_allocated_capacity = 0;
    parse.LastErrorState = 0;
    parse._212_4_ = 0;
    parse.ErrorStackStr._M_dataplus._M_p = (pointer)0x0;
    parse.ErrorStackStr.field_2._8_4_ = 0;
    parse.Stream.pSourceStream =
         (TokenStream<SGParser::Generator::RegExprParseToken> *)
         parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream;
    parse.Stream.Pos = parse.Stream.LengthLeft;
    parse.StackSize = parse.StackPosition;
    parse.ErrorMarker = (size_t)parse.pValidTokenStackPositions;
    local_40 = macroNFAs;
    CreateRegExpGrammar(this,(Grammar *)((long)&msg.FileName.field_2 + 8));
    bVar1 = ParseTableGen::Create
                      (&this->NFAParseTable,(Grammar *)((long)&msg.FileName.field_2 + 8),CLR);
    Grammar::~Grammar((Grammar *)((long)&msg.FileName.field_2 + 8));
    macroNFAs = local_40;
    if (!bVar1) {
      return false;
    }
  }
  local_2f8 = (regExp->_M_dataplus)._M_p;
  sStack_2f0 = regExp->_M_string_length;
  local_300._vptr_InputStream = (_func_int **)&PTR__MemBufferInputStream_0015a2e0;
  local_2e8 = 0;
  RegExpTokenizer<SGParser::Generator::RegExprParseToken>::RegExpTokenizer
            ((RegExpTokenizer<SGParser::Generator::RegExprParseToken> *)local_e0,&local_300);
  Parse<SGParser::Generator::RegExprNFAParseElement>::Parse
            ((Parse<SGParser::Generator::RegExprNFAParseElement> *)((long)&msg.FileName.field_2 + 8)
             ,&(this->NFAParseTable).super_ParseTable,
             (TokenStream<SGParser::Generator::RegExprParseToken> *)local_e0,0x800);
  local_2e0._vptr_ParseHandler = (_func_int **)&PTR__ParseHandler_0015cc40;
  local_2d8 = nfa->LexemeId;
  local_2d0 = this;
  local_2c8 = macroNFAs;
  bVar1 = Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
                    ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                     ((long)&msg.FileName.field_2 + 8),&local_2e0);
  if (bVar1) {
    pRVar2 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                        ((long)&msg.FileName.field_2 + 8),0);
    NFA::MoveData(nfa,(pRVar2->field_1).pNFA);
    pRVar2 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                        ((long)&msg.FileName.field_2 + 8),0);
    RegExprNFAParseElement::Destroy(pRVar2);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38,"",
               &local_32);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"NFA: Regular expression parsing error",&local_31);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    ParseMessage::ParseMessage
              ((ParseMessage *)local_2c0,ErrorMessage,
               (String *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38,
               &local_80,0,0xffffffffffffffff,0xffffffffffffffff,&local_60,0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string
              ((string *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38);
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)local_2c0);
    ParseMessage::~ParseMessage((ParseMessage *)local_2c0);
  }
  Parse<SGParser::Generator::RegExprNFAParseElement>::~Parse
            ((Parse<SGParser::Generator::RegExprNFAParseElement> *)((long)&msg.FileName.field_2 + 8)
            );
  TokenizerBase::FreeAllBuffers((TokenizerBase *)&tokenizer);
  return bVar1;
}

Assistant:

bool Lex::MakeNFA(NFA& nfa, const String& regExp, std::map<String, NFA*>& macroNFAs) {
    if (!NFAParseTable.IsValid()) {
        // Create the hard coded Regular Expression grammar
        Grammar grammar;
        CreateRegExpGrammar(grammar);

        // And make parse table out of it
        if (!NFAParseTable.Create(grammar))
            return false;  // Should probably throw exception
    }

    // Make an input stream with the regular expression string we've got
    MemBufferInputStream inputStream{regExp};

    // Create a tokenizer to get input. Since we're giving it a nullptr lexeme list,
    // it will just return each character exactly as it appears in the input string
    RegExpTokenizer<RegExprParseToken> tokenizer{&inputStream};

    // Initialize Parsing
    Parse<RegExprNFAParseElement> parse{&NFAParseTable, &tokenizer};
    RegExprNFAParseHandler        parseHandler;

    // Set the custom parse handler custom data
    parseHandler.LexemeID   = nfa.GetLexemeID();
    parseHandler.pLex       = this;
    parseHandler.pMacroNFAs = &macroNFAs;

    // Let the parse class parse the regular expression using
    // using the custom parseHandler reduce callback
    if (!parse.DoParse(parseHandler)) {
        const ParseMessage msg{ParseMessage::ErrorMessage, "",
                               "NFA: Regular expression parsing error"};
        Messages.AddMessage(msg);
        return false;
    }

    // Move result NFA data over to us, and destroy result NFA
    nfa.MoveData(*parse[0].pNFA);
    parse[0].Destroy();

    return true;
}